

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::cleanup::ChunkList::AddFallback
          (ChunkList *this,void *elem,_func_void_void_ptr *destructor,SerialArena *arena)

{
  Nullable<const_char_*> failure_msg;
  size_t sVar1;
  Chunk *pCVar2;
  ulong uVar3;
  size_t size;
  AllocationPolicy *policy;
  SizedPtr SVar4;
  LogMessageFatal local_30;
  
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::internal::cleanup::CleanupNode*,google::protobuf::internal::cleanup::CleanupNode*>
                          (&this->next_,&this->limit_,"next_ == limit_");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    policy = (AllocationPolicy *)((arena->parent_->alloc_policy_).policy_ & 0xfffffffffffffff8);
    if (this->head_ == (Chunk *)0x0) {
      sVar1 = 0;
    }
    else {
      sVar1 = this->head_->size;
    }
    uVar3 = 0x1000;
    if (sVar1 * 2 < 0x1000) {
      uVar3 = sVar1 * 2;
    }
    size = 0x40;
    if (sVar1 != 0) {
      size = uVar3;
    }
    if (policy == (AllocationPolicy *)0x0) {
      SVar4 = AllocateAtLeast(size);
    }
    else {
      SVar4 = anon_unknown_12::AllocateMemory(policy,size);
    }
    sVar1 = SVar4.n;
    pCVar2 = (Chunk *)SVar4.p;
    (arena->space_allocated_).super___atomic_base<unsigned_long>._M_i =
         (arena->space_allocated_).super___atomic_base<unsigned_long>._M_i + sVar1;
    pCVar2->next = this->head_;
    pCVar2->size = sVar1;
    this->head_ = pCVar2;
    this->prefetch_ptr_ = (char *)(pCVar2 + 1);
    this->limit_ = (CleanupNode *)((long)&pCVar2[1].next + (sVar1 - 0x10 & 0xfffffffffffffff0));
    this->next_ = (CleanupNode *)(pCVar2 + 2);
    pCVar2[1].next = (Chunk *)elem;
    pCVar2[1].size = (size_t)destructor;
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
             ,0x81,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
}

Assistant:

void ChunkList::AddFallback(
    void* PROTOBUF_NONNULL elem,
    void (*PROTOBUF_NONNULL destructor)(void* PROTOBUF_NONNULL),
    SerialArena& arena) {
  ABSL_DCHECK_EQ(next_, limit_);
  SizedPtr mem = AllocateCleanupChunk(arena.parent_.AllocPolicy(),
                                      head_ == nullptr ? 0 : head_->size);
  arena.AddSpaceAllocated(mem.n);
  head_ = new (mem.p) Chunk{head_, mem.n};
  next_ = head_->First();
  prefetch_ptr_ = reinterpret_cast<char*>(next_);
  limit_ = next_ + Chunk::Capacity(mem.n);
  AddFromExisting(elem, destructor);
}